

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O2

iterator __thiscall
nestl::impl::detail::
rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
::m_lower_bound(rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
                *this,link_type x,link_type y,void **k)

{
  bool bVar1;
  
  for (; x != (link_type)0x0; x = (link_type)(&(x->super_rb_tree_node_base).m_left)[bVar1]) {
    bVar1 = (ulong)(x->m_storage).m_storage < *k;
    if (!bVar1) {
      y = x;
    }
  }
  return (iterator)y;
}

Assistant:

typename rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::iterator
rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::m_lower_bound(link_type x, link_type y, const Key& k) NESTL_NOEXCEPT_SPEC
{
    while (x != 0)
    {
        if (!m_impl.m_key_compare(s_key(x), k))
        {
            y = x, x = s_left(x);
        }
        else
        {
            x = s_right(x);
        }
    }
    return iterator(y);
}